

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

int argumentList(int isPrototype,object *proc,int parBlkSize)

{
  int parBlkSize_00;
  char *msg;
  object *unaff_R14;
  
  if (isPrototype == 1) {
    parBlkSize_00 = prototypeArgument(parBlkSize);
  }
  else {
    unaff_R14 = proc->dsc;
    parBlkSize_00 = argument(proc,parBlkSize,unaff_R14);
    if (proc->hasPrototype == 1) goto LAB_001061eb;
  }
LAB_00106205:
  do {
    if (currentSymbol != 0xcc) {
      if (((isPrototype != 0) || (proc->hasPrototype != 1)) || (unaff_R14 == guard)) {
        return parBlkSize_00;
      }
      msg = "prototype requires more arguments";
LAB_0010626f:
      mark(msg);
      exit(-1);
    }
    getSymbol();
    if (isPrototype != 1) {
      if (proc->hasPrototype == 1) {
        if (unaff_R14 == guard) {
          msg = "number of args differ";
          goto LAB_0010626f;
        }
        parBlkSize_00 = argument(proc,parBlkSize_00,unaff_R14);
LAB_001061eb:
        unaff_R14 = unaff_R14->next;
      }
      else {
        parBlkSize_00 = argument(proc,parBlkSize_00,unaff_R14);
      }
      goto LAB_00106205;
    }
    parBlkSize_00 = prototypeArgument(parBlkSize_00);
  } while( true );
}

Assistant:

procedure 
int argumentList(int isPrototype, struct object *proc, int parBlkSize) {
	variable int parSize; 
	variable struct object *first;
	parSize = 0; 
	if (isPrototype==1) {
		parSize = prototypeArgument(parBlkSize);
	} else {
		first = proc->dsc; /* not next because we are still at the head */
		parSize = argument(proc,parBlkSize,first);
		if (proc->hasPrototype == true) {
			first = first->next; /* next argument (might be guard) */
		}
	}
	while (currentSymbol == SYMBOL_COMMA) {
		getSymbol();
		if (isPrototype==1) {
			parSize = prototypeArgument(parSize);
		} else {
			if (proc->hasPrototype == true) {
				if (first == guard) {
					mark("number of args differ");
					exit(-1);
				}
				parSize = argument(proc,parSize,first);
				first = first->next;
			} else {
				parSize = argument(proc,parSize,first);
			}
		}
		
	}
	if ((isPrototype == 0) && (proc->hasPrototype == true)) {
		if (first != guard) {
			mark("prototype requires more arguments");
			exit(-1);
		}
	}
	return parSize;
}